

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

Type * slang::ast::Type::getPredefinedType(Compilation *compilation,SyntaxKind kind,bool isSigned)

{
  Type *this;
  PredefinedIntegerType *pPVar1;
  ScalarType *pSVar2;
  bool local_11;
  
  this = Compilation::getType(compilation,kind);
  pPVar1 = (PredefinedIntegerType *)Symbol::as<slang::ast::IntegralType>(&this->super_Symbol);
  if ((pPVar1->super_IntegralType).isSigned != isSigned) {
    if ((pPVar1->super_IntegralType).super_Type.super_Symbol.kind == ScalarType) {
      pSVar2 = Symbol::as<slang::ast::ScalarType>((Symbol *)pPVar1);
      pPVar1 = (PredefinedIntegerType *)
               BumpAllocator::
               emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pSVar2->scalarKind,&local_11);
    }
    else {
      pPVar1 = Symbol::as<slang::ast::PredefinedIntegerType>((Symbol *)pPVar1);
      pPVar1 = BumpAllocator::
               emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pPVar1->integerKind,&local_11);
    }
  }
  return (Type *)pPVar1;
}

Assistant:

const Type& Type::getPredefinedType(Compilation& compilation, SyntaxKind kind, bool isSigned) {
    auto& predef = compilation.getType(kind).as<IntegralType>();
    if (isSigned == predef.isSigned)
        return predef;

    if (predef.kind == SymbolKind::ScalarType)
        return *compilation.emplace<ScalarType>(predef.as<ScalarType>().scalarKind, isSigned);

    return *compilation.emplace<PredefinedIntegerType>(
        predef.as<PredefinedIntegerType>().integerKind, isSigned);
}